

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonAnalyticalPricer.cpp
# Opt level: O2

double __thiscall
VarianceSwapsHestonAnalyticalPricer::u1Term
          (VarianceSwapsHestonAnalyticalPricer *this,double t1,double t2)

{
  double dVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double tau;
  double dVar2;
  undefined8 uVar3;
  complex<double> D1;
  complex<double> C1;
  double local_48;
  double dStack_40;
  complex<double> local_38;
  undefined1 local_28 [16];
  
  tau = t2 - t1;
  dVar1 = HestonModel::getInitialVolatility(this->hestonModel_);
  dVar2 = 0.0;
  functionCPrime(this,tau,0.0);
  local_28._8_8_ = dVar2;
  functionCSecond(this,tau,0.0);
  uVar3 = 0;
  functionDPrime(this,tau,0.0);
  local_38._M_value._8_8_ = uVar3;
  functionDSecond(this,tau,0.0);
  std::operator*(&local_38,&local_38);
  local_48 = extraout_XMM0_Qa + extraout_XMM0_Qa;
  dStack_40 = dVar2 + dVar2;
  std::operator*((complex<double> *)&local_48,&local_38);
  std::operator*((complex<double> *)local_28,(complex<double> *)local_28);
  return (extraout_XMM0_Qa_04 - extraout_XMM0_Qa_00) +
         (extraout_XMM0_Qa_03 - extraout_XMM0_Qa_01) * dVar1 + extraout_XMM0_Qa_02 * dVar1 * dVar1;
}

Assistant:

double VarianceSwapsHestonAnalyticalPricer::
u1Term(double t1, double t2) const {
    double delta = t2-t1,
           v0 = hestonModel_->getInitialVolatility();
    std::complex<double> C1 = functionCPrime(delta,0.),
                        C2 = functionCSecond(delta,0.),
                        D1 = functionDPrime(delta,0.),
                        D2 = functionDSecond(delta,0.);
    std::complex<double> firstTerm = D1*D1*v0*v0,
                        secondTerm = v0*(2.0*C1*D1-D2),
                        thirdTerm = C1*C1 - C2;
    std::complex<double> u1 = firstTerm+secondTerm+thirdTerm; 
    return u1.real();
}